

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_fasta.cpp
# Opt level: O0

bool __thiscall
BamTools::Fasta::FastaPrivate::Open(FastaPrivate *this,string *filename,string *indexFilename)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  FILE *pFVar4;
  ostream *poVar5;
  ulong uVar6;
  string *in_RDX;
  string *in_RSI;
  long *in_RDI;
  bool success;
  FastaPrivate *in_stack_000005f8;
  bool local_1;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pFVar4 = fopen64(pcVar3,"rb");
  *in_RDI = (long)pFVar4;
  if (*in_RDI == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"FASTA error: Could not open ");
    poVar5 = std::operator<<(poVar5,in_RSI);
    poVar5 = std::operator<<(poVar5," for reading");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  else {
    *(undefined1 *)(in_RDI + 1) = 1;
    local_1 = (*(byte *)(in_RDI + 1) & 1) != 0;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      pFVar4 = fopen64(pcVar3,"rb");
      in_RDI[2] = (long)pFVar4;
      if (in_RDI[2] == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"FASTA error : Could not open ");
        poVar5 = std::operator<<(poVar5,in_RDX);
        poVar5 = std::operator<<(poVar5," for reading.");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        local_1 = false;
      }
      else {
        *(undefined1 *)((long)in_RDI + 0x19) = 1;
        bVar1 = *(byte *)((long)in_RDI + 0x19);
        bVar2 = LoadIndexData(in_stack_000005f8);
        *(bool *)(in_RDI + 3) = bVar2;
        local_1 = ((local_1 & bVar1 & 1) != 0 & *(byte *)(in_RDI + 3) & 1) != 0;
      }
    }
  }
  return local_1;
}

Assistant:

bool Fasta::FastaPrivate::Open(const std::string& filename, const std::string& indexFilename)
{

    bool success = true;

    // open FASTA filename
    Stream = fopen(filename.c_str(), "rb");
    if (!Stream) {
        std::cerr << "FASTA error: Could not open " << filename << " for reading" << std::endl;
        return false;
    }
    IsOpen = true;
    success &= IsOpen;

    // open index file if it exists
    if (!indexFilename.empty()) {
        IndexStream = fopen(indexFilename.c_str(), "rb");
        if (!IndexStream) {
            std::cerr << "FASTA error : Could not open " << indexFilename << " for reading."
                      << std::endl;
            return false;
        }
        IsIndexOpen = true;
        success &= IsIndexOpen;

        // attempt to load index data
        HasIndex = LoadIndexData();
        success &= HasIndex;
    }

    // return success status
    return success;
}